

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O3

void __thiscall
L13_3::BankAccountPlus::BankAccountPlus
          (BankAccountPlus *this,BankAccount *ba,double max_loan,double rate)

{
  pointer pcVar1;
  double dVar2;
  
  (this->super_Account)._vptr_Account = (_func_int **)&PTR___cxa_pure_virtual_00134340;
  (this->super_Account)._name._M_dataplus._M_p = (pointer)&(this->super_Account)._name.field_2;
  pcVar1 = (ba->super_Account)._name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Account)._name,pcVar1,
             pcVar1 + (ba->super_Account)._name._M_string_length);
  dVar2 = (ba->super_Account)._balance;
  (this->super_Account)._number = (ba->super_Account)._number;
  (this->super_Account)._balance = dVar2;
  (this->super_Account)._vptr_Account = (_func_int **)&PTR_withdraw_00134370;
  this->_max_loan = max_loan;
  this->_rate = rate;
  this->_loan = 0.0;
  return;
}

Assistant:

BankAccountPlus::BankAccountPlus(const BankAccount &ba, double max_loan, double rate): Account(ba) {
        _max_loan = max_loan;
        _rate = rate;
        _loan = 0;
    }